

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAig.c
# Opt level: O2

Gia_Man_t * Gia_ManCompress2(Gia_Man_t *p,int fUpdateLevel,int fVerbose)

{
  Aig_Man_t *pAig;
  Aig_Man_t *p_00;
  Gia_Man_t *p_01;
  
  if ((p->pManTime != (void *)0x0) && (p->vLevels == (Vec_Int_t *)0x0)) {
    Gia_ManLevelWithBoxes(p);
  }
  pAig = Gia_ManToAig(p,0);
  p_00 = Dar_ManCompress2(pAig,1,fUpdateLevel,1,0,fVerbose);
  Aig_ManStop(pAig);
  p_01 = Gia_ManFromAig(p_00);
  Aig_ManStop(p_00);
  Gia_ManTransferTiming(p_01,p);
  return p_01;
}

Assistant:

Gia_Man_t * Gia_ManCompress2( Gia_Man_t * p, int fUpdateLevel, int fVerbose )
{
    Gia_Man_t * pGia;
    Aig_Man_t * pNew, * pTemp;
    if ( p->pManTime && p->vLevels == NULL )
        Gia_ManLevelWithBoxes( p );
    pNew = Gia_ManToAig( p, 0 );
    pNew = Dar_ManCompress2( pTemp = pNew, 1, fUpdateLevel, 1, 0, fVerbose );
    Aig_ManStop( pTemp );
    pGia = Gia_ManFromAig( pNew );
    Aig_ManStop( pNew );
    Gia_ManTransferTiming( pGia, p );
    return pGia;
}